

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O0

void Dtt_ManRenum(int nVars,uint *pTable,int *pnClasses)

{
  uint local_2c;
  uint Count;
  uint Limit;
  uint i;
  int *pnClasses_local;
  uint *pTable_local;
  int nVars_local;
  
  local_2c = 0;
  Count = 0;
  do {
    if ((uint)(1 << ((char)(1 << ((byte)nVars & 0x1f)) - 1U & 0x1f)) <= Count) {
      printf("The total number of NPN classes = %d.\n",(ulong)local_2c);
      *pnClasses = local_2c;
      return;
    }
    if (pTable[Count] == Count) {
      pTable[Count] = local_2c;
      local_2c = local_2c + 1;
    }
    else {
      if (Count <= pTable[Count]) {
        __assert_fail("pTable[i] < i",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNpn2.c"
                      ,0x153,"void Dtt_ManRenum(int, unsigned int *, int *)");
      }
      pTable[Count] = pTable[pTable[Count]];
    }
    Count = Count + 1;
  } while( true );
}

Assistant:

void Dtt_ManRenum( int nVars, unsigned * pTable, int * pnClasses )
{
    unsigned i, Limit = 1 << ((1 << nVars)-1), Count = 0;
    for ( i = 0; i < Limit; i++ )
        if ( pTable[i] == i )
            pTable[i] = Count++;
        else 
        {
            assert( pTable[i] < i );
            pTable[i] = pTable[pTable[i]];
        }
    printf( "The total number of NPN classes = %d.\n", Count );
    *pnClasses = Count;
}